

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_get_lots(planck_unit_test_t *tc)

{
  uint uVar1;
  int iVar2;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  int local_a8;
  uint local_a4;
  int local_a0;
  uint local_9c;
  ion_dictionary_t local_98;
  ion_dictionary_handler_t local_80;
  
  bhdct_setup(tc,&local_80,&local_98,ion_fill_none);
  uVar1 = 0x11d;
  iVar2 = 0x5dc;
  do {
    uVar1 = uVar1 + 0xf;
    local_a0 = iVar2;
    local_9c = uVar1;
    bhdct_insert(tc,&local_98,&local_9c,&local_a0,'\x01');
    iVar2 = iVar2 + 0x4b;
  } while (uVar1 < 0x3d9);
  uVar1 = 0x11d;
  iVar2 = 0x5dc;
  do {
    uVar1 = uVar1 + 0xf;
    local_a8 = iVar2;
    local_a4 = uVar1;
    bhdct_get(tc,&local_98,&local_a4,&local_a8,'\0',1);
    iVar2 = iVar2 + 0x4b;
  } while (uVar1 < 0x3d9);
  bhdct_delete_dictionary(tc,&local_98);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_get_lots(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	int i;

	for (i = 300; i < 1000; i += 15) {
		bhdct_insert(tc, &dict, IONIZE(i, int), IONIZE(i * 5, int), boolean_true);
	}

	for (i = 300; i < 1000; i += 15) {
		bhdct_get(tc, &dict, IONIZE(i, int), IONIZE(i * 5, int), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}